

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

QList<QSsl::SslProtocol> * QSslSocket::supportedProtocols(QString *backendName)

{
  long lVar1;
  qsizetype qVar2;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffb8;
  QString *backendName_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  backendName_00 = in_RDI;
  qVar2 = QString::size(in_RSI);
  if (qVar2 == 0) {
    activeBackend();
  }
  else {
    QString::QString(in_RDI,in_stack_ffffffffffffffb8);
  }
  QTlsBackend::supportedProtocols(backendName_00);
  QString::~QString((QString *)0x3a4014);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QList<QSsl::SslProtocol> *)backendName_00;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSsl::SslProtocol> QSslSocket::supportedProtocols(const QString &backendName)
{
    return QTlsBackend::supportedProtocols(backendName.size() ? backendName : activeBackend());
}